

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O2

size_t axl::sl::
       BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
       ::locateBinOffset(BoyerMooreTextState *state,size_t i,char *p,char *end)

{
  size_t *psVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  char *buffer;
  size_t pos;
  ConvertLengthResult CVar7;
  ConvertLengthResult CVar8;
  DecoderState decoderState;
  DecoderState decoderState_1;
  DecoderState local_5c;
  size_t local_58;
  char *local_50;
  char *local_48;
  size_t local_40;
  DecoderState local_34;
  
  sVar6 = (state->m_binTail).super_CircularBufferBase<char>.m_length;
  psVar1 = &(state->super_BoyerMooreStateBase<wchar_t>).m_tail.m_length;
  pos = i - *psVar1;
  if (i < *psVar1) {
    local_5c = 0;
    pcVar2 = (state->m_binTail).super_CircularBufferBase<char>.m_buffer.
             super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p;
    sVar3 = (state->m_binTail).super_CircularBufferBase<char>.m_front;
    sVar4 = (state->m_binTail).super_CircularBufferBase<char>.m_back;
    local_50 = p;
    local_48 = end;
    local_40 = sVar6;
    if ((long)sVar3 < (long)sVar4) {
      CVar7 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder>::locate
                        (&local_5c,i,pcVar2 + (sVar4 - 1),pcVar2 + (sVar3 - 1));
    }
    else {
      local_58 = (state->m_binTail).super_CircularBufferBase<char>.m_buffer.
                 super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
      CVar7 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder>::locate
                        (&local_5c,i,pcVar2 + (sVar4 - 1),pcVar2 + -1);
      uVar5 = CVar7.m_dstLength;
      if (uVar5 <= i && i - uVar5 != 0) {
        CVar8 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder>::locate
                          (&local_5c,i - uVar5,pcVar2 + (local_58 - 1),pcVar2 + (sVar3 - 1));
        CVar7.m_srcLength = CVar7.m_srcLength + CVar8.m_srcLength;
        CVar7.m_dstLength = uVar5 + CVar8.m_dstLength;
      }
    }
    sVar6 = CVar7.m_srcLength;
    if (CVar7.m_dstLength < i) {
      CVar7 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder>::locate
                        (&local_5c,pos,local_50,local_48);
      sVar6 = CVar7.m_srcLength + local_40;
    }
  }
  else {
    local_34 = state->m_decoderState;
    CVar7 = enc::Locate<axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder>::locate(&local_34,pos,p,end);
    sVar6 = CVar7.m_srcLength + sVar6;
  }
  return sVar6;
}

Assistant:

void
	clear() {
		m_pattern.clear();
		m_skipTables.clear();
	}